

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O2

deBool vk::BinaryRegistryDetail::anon_unknown_8::binaryEqual(ProgramBinary *a,ProgramBinary *b)

{
  pointer puVar1;
  pointer puVar2;
  deBool dVar3;
  size_t numBytes;
  pointer cmp;
  pointer ptr;
  
  ptr = (a->m_binary).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start;
  puVar1 = (a->m_binary).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  numBytes = (long)puVar1 - (long)ptr;
  cmp = (b->m_binary).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start;
  puVar2 = (b->m_binary).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (numBytes == (long)puVar2 - (long)cmp) {
    if (ptr == puVar1) {
      ptr = (pointer)0x0;
    }
    if (cmp == puVar2) {
      cmp = (pointer)0x0;
    }
    dVar3 = deMemoryEqual(ptr,cmp,numBytes);
    return dVar3;
  }
  return 0;
}

Assistant:

deBool binaryEqual (const ProgramBinary* a, const ProgramBinary* b)
{
	if (a->getSize() == b->getSize())
		return deMemoryEqual(a->getBinary(), b->getBinary(), a->getSize());
	else
		return DE_FALSE;
}